

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float * __thiscall ImGuiStorage::GetFloatRef(ImGuiStorage *this,ImGuiID key,float default_val)

{
  Pair *pPVar1;
  Pair *it;
  ulong uVar2;
  ulong uVar3;
  ulong uVar5;
  Pair local_10;
  ulong uVar4;
  
  uVar2 = (ulong)(this->Data).Size;
  pPVar1 = (this->Data).Data;
  it = pPVar1;
  uVar4 = uVar2;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    do {
      uVar3 = uVar4 >> 1;
      uVar5 = uVar3;
      if (it[uVar3].key < key) {
        uVar5 = ~uVar3 + uVar4;
        it = it + uVar3 + 1;
      }
      uVar4 = uVar5;
    } while (uVar5 != 0);
  }
  if ((it == pPVar1 + uVar2) || (it->key != key)) {
    local_10.key = key;
    local_10.field_1.val_f = default_val;
    it = ImVector<ImGuiStorage::Pair>::insert(&this->Data,it,&local_10);
  }
  return (float *)&it->field_1;
}

Assistant:

float* ImGuiStorage::GetFloatRef(ImGuiID key, float default_val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_f;
}